

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Question>::dispose
          (ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Question> *this)

{
  Question *firstElement;
  RemoveConst<capnp::_::RpcSystemBase::RpcConnectionState::Question> *pRVar1;
  Question *pQVar2;
  Question *endCopy;
  Question *posCopy;
  Question *ptrCopy;
  ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Question> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pQVar2 = this->endPtr;
  if (firstElement != (Question *)0x0) {
    this->ptr = (Question *)0x0;
    this->pos = (RemoveConst<capnp::_::RpcSystemBase::RpcConnectionState::Question> *)0x0;
    this->endPtr = (Question *)0x0;
    ArrayDisposer::dispose<capnp::_::RpcSystemBase::RpcConnectionState::Question>
              (this->disposer,firstElement,((long)pRVar1 - (long)firstElement) / 0x28,
               ((long)pQVar2 - (long)firstElement) / 0x28);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }